

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

void free_attr_list(attr_list list)

{
  attr_p __ptr;
  short sVar1;
  void *__ptr_00;
  attr_list *__ptr_01;
  int i;
  long lVar2;
  ulong uVar3;
  
  if ((list == (attr_list)0x0) || (sVar1 = list->ref_count + -1, list->ref_count = sVar1, 0 < sVar1)
     ) {
    return;
  }
  if (list->list_of_lists == 0) {
    lVar2 = 0x10;
    for (uVar3 = 0; __ptr = (list->l).list.attributes,
        uVar3 < ((list->l).list.iattrs)->other_attr_count; uVar3 = uVar3 + 1) {
      switch(*(undefined4 *)((long)__ptr + lVar2 + -0xc)) {
      case 0:
      case 1:
      case 2:
      case 5:
      case 7:
      case 8:
      case 9:
        break;
      case 3:
        __ptr_00 = *(void **)((long)__ptr + lVar2 + -8);
        goto LAB_00105914;
      case 4:
        __ptr_00 = *(void **)((long)&__ptr->attr_id + lVar2);
LAB_00105914:
        free(__ptr_00);
        break;
      case 6:
        free_attr_list(*(attr_list *)((long)__ptr + lVar2 + -8));
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                      ,0x5e4,"void free_attr_list(attr_list)");
      }
      lVar2 = lVar2 + 0x18;
    }
    free(__ptr);
    __ptr_01 = (list->l).lists.lists;
  }
  else {
    for (lVar2 = 0; __ptr_01 = (list->l).lists.lists, lVar2 < (list->l).lists.sublist_count;
        lVar2 = lVar2 + 1) {
      free_attr_list(__ptr_01[lVar2]);
    }
  }
  free(__ptr_01);
  free(list);
  return;
}

Assistant:

void
free_attr_list(attr_list list)
{
    if (list == NULL) return;
    list->ref_count--;
    if (list->ref_count > 0) return;
    if (list->list_of_lists) {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            free_attr_list(list->l.lists.lists[i]);
        }
        free(list->l.lists.lists);
        free(list);
    } else {
        int i;
        for (i=0; i< list->l.list.iattrs->other_attr_count; i++) {
            switch (list->l.list.attributes[i].val_type) {
            case Attr_Undefined:
            case Attr_Int4:
            case Attr_Int8:
	    case Attr_Float16:
	    case Attr_Float8:
	    case Attr_Float4:
                break;
            case Attr_Atom:
                break;
            case Attr_String:
                free((char *)list->l.list.attributes[i].value.u.p);
                break;
            case Attr_Opaque: {
                attr_opaque o = list->l.list.attributes[i].value.u.o;
                if (o.buffer) {
                    free(o.buffer);
                }
                break;
            }
            case Attr_List:
                free_attr_list((attr_list)list->l.list.attributes[i].value.u.p);
                break;                  
            default:
                assert(0);
            }
        }
        if (list->l.list.attributes != NULL) {
            free(list->l.list.attributes);
        }
	if (list->l.list.iattrs != NULL) {
	    free(list->l.list.iattrs);
	    list->l.list.iattrs = NULL;
	}
        free(list);
    }      
}